

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_igsdb_shading_layer_json.unit.cpp
# Opt level: O1

void __thiscall
TestLoadIGSDBJSONFromDisk_TestLoadIGSDBPerforatedScreenShadingLayerJSON_Test::TestBody
          (TestLoadIGSDBJSONFromDisk_TestLoadIGSDBPerforatedScreenShadingLayerJSON_Test *this)

{
  pointer pWVar1;
  long lVar2;
  variant_alternative_t<0UL,_variant<vector<WLData,_allocator<WLData>_>,_DualBandBSDF>_> *pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  char *pcVar4;
  AssertionResult gtest_ar;
  ScopedTrace gtest_trace_60;
  Parser parser;
  path product_path;
  ProductData product;
  AssertHelper local_9c8;
  _Storage<double,_true> local_9c0;
  undefined1 local_9b8;
  undefined1 local_9b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a0;
  ScopedTrace local_98a;
  Parser local_989;
  path local_988;
  ProductData local_960;
  
  testing::ScopedTrace::ScopedTrace
            (&local_98a,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
             ,0x3c,"Begin Test: Load IGSDB perforated shading layer json format.");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            (&local_988,
             (char (*) [96])
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test"
             ,auto_format);
  std::filesystem::__cxx11::path::_M_append(&local_988,8,"products");
  std::filesystem::__cxx11::path::_M_append(&local_988,0x18,"igsdb_v1_perforated.json");
  local_9b0 = (undefined1  [8])&local_9a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9b0,local_988._M_pathname._M_dataplus._M_p,
             local_988._M_pathname._M_dataplus._M_p + local_988._M_pathname._M_string_length);
  OpticsParser::Parser::parseJSONFile(&local_960,&local_989,(string *)local_9b0);
  if (local_9b0 != (undefined1  [8])&local_9a0) {
    operator_delete((void *)local_9b0,local_9a0._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[30]>
            ((internal *)local_9b0,"product.name","\"Solar Comfort Radiant Barrier\"",
             &local_960.name,(char (*) [30])"Solar Comfort Radiant Barrier");
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x46,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)local_9b0,"product.productType","\"shading\"",&local_960.productType,
             (char (*) [8])"shading");
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x47,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[14]>
            ((internal *)local_9b0,"product.manufacturer","\"Solar Comfort\"",
             &local_960.manufacturer,(char (*) [14])"Solar Comfort");
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x48,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9b8 = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)local_9b0,"product.thickness","std::optional<double>()",
             &local_960.thickness,(optional<double> *)&local_9c0);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x49,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9b8 = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)local_9b0,"product.IRTransmittance","std::optional<double>()",
             &local_960.IRTransmittance,(optional<double> *)&local_9c0);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9b8 = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)local_9b0,"product.frontEmissivity","std::optional<double>()",
             &local_960.frontEmissivity,(optional<double> *)&local_9c0);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9b8 = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)local_9b0,"product.backEmissivity","std::optional<double>()",
             &local_960.backEmissivity,(optional<double> *)&local_9c0);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._0_1_ =
       local_960.measurements.
       super__Optional_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_true,_false,_false>
       .
       super__Optional_payload_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
       ._M_engaged;
  local_9c8.data_._0_4_ = (uint)local_9c8.data_ & 0xffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_9b0,"product.measurements.has_value()","false",(bool *)&local_9c0,
             (bool *)&local_9c8);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  if (local_960.geometry.
      super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(local_960.geometry.
                           super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&OpticsParser::ProductGeometry::typeinfo,
                           &OpticsParser::PerforatedGeometry::typeinfo,0);
  }
  if (lVar2 == 0) {
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar2 = 0;
  }
  else {
    this_00._M_pi =
         local_960.geometry.
         super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_960.geometry.
        super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_960.geometry.
         super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_960.geometry.
              super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_960.geometry.
         super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_960.geometry.
              super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
  }
  local_9c0._M_value = (double)&DAT_3ffb0a3d70a3d70a;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"geometry->spacingX","1.69",(double *)(lVar2 + 8),
             &local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x51,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_3ffb0a3d70a3d70a;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"geometry->spacingY","1.69",(double *)(lVar2 + 0x10),
             &local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x52,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_3fe28f5c28f5c28f;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"geometry->dimensionX","0.58",(double *)(lVar2 + 0x18),
             &local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x53,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_4019666666666666;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"geometry->dimensionY","6.35",(double *)(lVar2 + 0x20),
             &local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x54,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_9b0,"geometry->perforationType","\"Circular\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x28),
             (char (*) [9])"Circular");
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x55,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  if (local_960.materialDefinition.
      super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_960.materialDefinition.
       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_960.materialDefinition.
            super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_960.materialDefinition.
       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_960.materialDefinition.
            super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[21]>
            ((internal *)local_9b0,"material->name","\"SCRadiantBarrier.txt\"",
             &(local_960.materialDefinition.
               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              name,(char (*) [21])"SCRadiantBarrier.txt");
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_9b0,"material->productType","\"material\"",
             &(local_960.materialDefinition.
               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              productType,(char (*) [9])0x19f817);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x58,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[14]>
            ((internal *)local_9b0,"material->manufacturer","\"Solar Comfort\"",
             &(local_960.materialDefinition.
               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              manufacturer,(char (*) [14])"Solar Comfort");
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_3fcd70a3d70a3d71;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)local_9b0,"material->thickness","0.23",
             &(local_960.materialDefinition.
               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              thickness,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = 0.0;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)local_9b0,"material->IRTransmittance","0.0",
             &(local_960.materialDefinition.
               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              IRTransmittance,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_3feb9db22d0e5604;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)local_9b0,"material->frontEmissivity","0.863",
             &(local_960.materialDefinition.
               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              frontEmissivity,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_3feae147ae147ae1;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)local_9b0,"material->backEmissivity","0.84",
             &(local_960.materialDefinition.
               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              backEmissivity,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_3fbeb851eb851eb8;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)local_9b0,"material->conductivity","0.12",
             &(local_960.materialDefinition.
               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              conductivity,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._0_1_ =
       ((local_960.materialDefinition.
         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       measurements).
       super__Optional_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_true,_false,_false>
       .
       super__Optional_payload_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
       ._M_engaged;
  local_9c8.data_._0_4_ = CONCAT31(local_9c8.data_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_9b0,"material->measurements.has_value()","true",(bool *)&local_9c0,
             (bool *)&local_9c8);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  if (((local_960.materialDefinition.
        super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      measurements).
      super__Optional_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_true,_false,_false>
      .
      super__Optional_payload_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
      ._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  pvVar3 = std::
           get<0ul,std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,OpticsParser::DualBandBSDF>
                     ((variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>
                       *)&(local_960.materialDefinition.
                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->measurements);
  local_9c0 = (_Storage<double,_true>)
              (((long)(pvVar3->
                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar3->
                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  local_9c8.data_._0_4_ = 0x1b9;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_9b0,"materialMeasurements.size()","441",(unsigned_long *)&local_9c0,
             (int *)&local_9c8);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x62,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_3fd3333333333333;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"materialMeasurements[0].wavelength","0.3",
             &((pvVar3->
               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>).
               _M_impl.super__Vector_impl_data._M_start)->wavelength,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,99,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  pWVar1 = (pvVar3->super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(bool *)((long)&(pWVar1->directComponent).
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) == false) {
    std::__throw_bad_optional_access();
  }
  local_9c0._M_value = 0.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"materialMeasurements[0].directComponent.value().tf","0.0",
             (double *)&pWVar1->directComponent,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,100,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  pWVar1 = (pvVar3->super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(bool *)((long)&(pWVar1->directComponent).
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) == false) {
    std::__throw_bad_optional_access();
  }
  local_9c0._M_value = (double)&DAT_3fb4538ef34d6a16;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"materialMeasurements[0].directComponent.value().rf","0.0794",
             (double *)
             ((long)&(pWVar1->directComponent).
                     super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>._M_payload
             + 0x10),&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x65,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  pWVar1 = (pvVar3->super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(bool *)((long)&(pWVar1->directComponent).
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) == false) {
    std::__throw_bad_optional_access();
  }
  local_9c0._M_value = (double)&DAT_3fb141205bc01a37;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"materialMeasurements[0].directComponent.value().rb","0.0674",
             (double *)
             ((long)&(pWVar1->directComponent).
                     super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>._M_payload
             + 0x18),&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x66,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  local_9c0._M_value = (double)&DAT_4004000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"materialMeasurements[440].wavelength","2.50",
             &(pvVar3->
              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>).
              _M_impl.super__Vector_impl_data._M_start[0x1b8].wavelength,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x67,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  pWVar1 = (pvVar3->super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(bool *)((long)&pWVar1[0x1b8].directComponent.
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) == false) {
    std::__throw_bad_optional_access();
  }
  local_9c0._M_value = 0.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"materialMeasurements[440].directComponent.value().tf","0.0",
             (double *)&pWVar1[0x1b8].directComponent,&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x68,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  pWVar1 = (pvVar3->super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(bool *)((long)&pWVar1[0x1b8].directComponent.
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) == false) {
    std::__throw_bad_optional_access();
  }
  local_9c0._M_value = (double)&DAT_3fe504816f0068dc;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_9b0,"materialMeasurements[440].directComponent.value().rf","0.6568",
             (double *)
             ((long)&pWVar1[0x1b8].directComponent.
                     super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>._M_payload
             + 0x10),&local_9c0._M_value);
  if (local_9b0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_9c0);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x69,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    if (local_9c0 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9c0 + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  pWVar1 = (pvVar3->super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(bool *)((long)&pWVar1[0x1b8].directComponent.
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) != false) {
    local_9c0._M_value = (double)&DAT_3fdeb851eb851eb8;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)local_9b0,"materialMeasurements[440].directComponent.value().rb","0.48",
               (double *)
               ((long)&pWVar1[0x1b8].directComponent.
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x18),&local_9c0._M_value);
    if (local_9b0[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_9c0);
      if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_9a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_9c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
                 ,0x6a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
      testing::internal::AssertHelper::~AssertHelper(&local_9c8);
      if (local_9c0 != (_Storage<double,_true>)0x0) {
        (**(code **)(*(long *)local_9c0 + 8))();
      }
    }
    if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_9a8,local_9a8);
    }
    if (local_960.materialDefinition.
        super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_960.materialDefinition.
                 super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    OpticsParser::ProductData::~ProductData(&local_960);
    std::filesystem::__cxx11::path::~path(&local_988);
    testing::ScopedTrace::~ScopedTrace(&local_98a);
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

TEST(TestLoadIGSDBJSONFromDisk, TestLoadIGSDBPerforatedScreenShadingLayerJSON)
{
    SCOPED_TRACE("Begin Test: Load IGSDB perforated shading layer json format.");
    std::filesystem::path product_path(TEST_DATA_DIR);
    product_path /= "products";
    product_path /= "igsdb_v1_perforated.json";

    OpticsParser::Parser parser;

	auto product = parser.parseJSONFile(product_path.string());

    //    EXPECT_EQ(product.nfrcid.value(), 102);
    EXPECT_EQ(product.name, "Solar Comfort Radiant Barrier");
    EXPECT_EQ(product.productType, "shading");
    EXPECT_EQ(product.manufacturer, "Solar Comfort");
    EXPECT_EQ(product.thickness, std::optional<double>());
    // TODO EXPECT_EQ(product.conductivity, 1.0);
    EXPECT_EQ(product.IRTransmittance, std::optional<double>());
    EXPECT_EQ(product.frontEmissivity, std::optional<double>());
    EXPECT_EQ(product.backEmissivity, std::optional<double>());
    EXPECT_EQ(product.measurements.has_value(), false);
    auto geometry = std::dynamic_pointer_cast<OpticsParser::PerforatedGeometry>(
      product.geometry);
    EXPECT_EQ(geometry->spacingX, 1.69);
    EXPECT_EQ(geometry->spacingY, 1.69);
    EXPECT_EQ(geometry->dimensionX, 0.58);
    EXPECT_EQ(geometry->dimensionY, 6.35);
    EXPECT_EQ(geometry->perforationType, "Circular");
    auto material = product.materialDefinition;
    EXPECT_EQ(material->name, "SCRadiantBarrier.txt");
    EXPECT_EQ(material->productType, "material");
    EXPECT_EQ(material->manufacturer, "Solar Comfort");
    EXPECT_EQ(material->thickness, 0.23);
    EXPECT_EQ(material->IRTransmittance, 0.0);
    EXPECT_EQ(material->frontEmissivity, 0.863);
    EXPECT_EQ(material->backEmissivity, 0.84);
    EXPECT_EQ(material->conductivity, 0.12);
    EXPECT_EQ(material->measurements.has_value(), true);
    auto & materialMeasurements =
      std::get<std::vector<OpticsParser::WLData>>(material->measurements.value());
    EXPECT_EQ(materialMeasurements.size(), 441);
    EXPECT_EQ(materialMeasurements[0].wavelength, 0.3);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().tf, 0.0);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().rf, 0.0794);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().rb, 0.0674);
    EXPECT_EQ(materialMeasurements[440].wavelength, 2.50);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().tf, 0.0);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().rf, 0.6568);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().rb, 0.48);
}